

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaDfs.c
# Opt level: O0

Vec_Int_t * Gia_ManCollectNodesCis(Gia_Man_t *p,int *pNodes,int nNodes)

{
  int iVar1;
  Vec_Int_t *vNodes_00;
  Gia_Obj_t *pGVar2;
  int local_34;
  int i;
  Gia_Obj_t *pObj;
  Vec_Int_t *vNodes;
  int nNodes_local;
  int *pNodes_local;
  Gia_Man_t *p_local;
  
  vNodes_00 = Vec_IntAlloc(10000);
  Gia_ManIncrementTravId(p);
  pGVar2 = Gia_ManConst0(p);
  Gia_ObjSetTravIdCurrent(p,pGVar2);
  for (local_34 = 0; local_34 < nNodes; local_34 = local_34 + 1) {
    pGVar2 = Gia_ManObj(p,pNodes[local_34]);
    iVar1 = Gia_ObjIsCo(pGVar2);
    if (iVar1 == 0) {
      Gia_ManCollectNodesCis_rec(p,pGVar2,vNodes_00);
    }
    else {
      pGVar2 = Gia_ObjFanin0(pGVar2);
      Gia_ManCollectNodesCis_rec(p,pGVar2,vNodes_00);
    }
  }
  return vNodes_00;
}

Assistant:

Vec_Int_t * Gia_ManCollectNodesCis( Gia_Man_t * p, int * pNodes, int nNodes )
{
    Vec_Int_t * vNodes;
    Gia_Obj_t * pObj;
    int i; 
    vNodes = Vec_IntAlloc( 10000 );
    Gia_ManIncrementTravId( p );
    Gia_ObjSetTravIdCurrent( p, Gia_ManConst0(p) );
    for ( i = 0; i < nNodes; i++ )
    {
        pObj = Gia_ManObj( p, pNodes[i] );
        if ( Gia_ObjIsCo(pObj) )
            Gia_ManCollectNodesCis_rec( p, Gia_ObjFanin0(pObj), vNodes );
        else
            Gia_ManCollectNodesCis_rec( p, pObj, vNodes );
    }
    return vNodes;
}